

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O3

bool __thiscall Analyzer::isVarCanBeString(Analyzer *this,Node *node)

{
  NodeType NVar1;
  char *__s1;
  Node *pNVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  pointer ppVar8;
  Node *a;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  undefined8 *puVar10;
  ulong uVar11;
  
  puVar3 = DAT_0013c558;
  while( true ) {
    a = node;
    bVar4 = a != (Node *)0x0;
    if (a == (Node *)0x0) {
      return bVar4;
    }
    NVar1 = a->nodeType;
    if (NVar1 != PNT_BINARY_OP) break;
    if ((a->tok->type != TK_NULLCOALESCE) ||
       (node = *(a->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start, node->nodeType != PNT_STRING)) goto LAB_0012660f;
  }
  if (NVar1 == PNT_STRING) {
    return bVar4;
  }
  if (NVar1 == PNT_FUNCTION_CALL) {
    pNVar2 = *(a->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pNVar2->nodeType == PNT_IDENTIFIER) {
      iVar5 = strcmp((pNVar2->tok->u).s,"loc");
      if (iVar5 == 0) {
        return true;
      }
    }
    else if (((pNVar2->nodeType == PNT_ACCESS_MEMBER) &&
             (lVar9 = *(long *)(*(long *)&(pNVar2->children).
                                          super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                          _M_impl.super__Vector_impl_data + 8),
             *(int *)(lVar9 + 0x10) == 6)) &&
            (settings::function_can_return_string_abi_cxx11_ != DAT_0013c558)) {
      __s1 = *(char **)(*(long *)(lVar9 + 8) + 0x10);
      puVar10 = settings::function_can_return_string_abi_cxx11_;
      do {
        iVar5 = strcmp(__s1,(char *)*puVar10);
        if (iVar5 == 0) {
          return true;
        }
        puVar10 = puVar10 + 4;
      } while (puVar10 != puVar3);
    }
  }
LAB_0012660f:
  uVar6 = (int)((long)nearest_assignments.
                      super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)nearest_assignments.
                      super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (0 < (int)uVar6) {
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    uVar11 = uVar7 + 1;
    lVar9 = uVar7 * 0x18;
    ppVar8 = nearest_assignments.
             super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pNVar2 = *(Node **)((long)&ppVar8[-1].first + lVar9);
      if ((pNVar2 != (Node *)0x0) &&
         (bVar4 = isNodeEquals(this,a,pNVar2),
         ppVar8 = nearest_assignments.
                  super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, bVar4)) {
        return *(int *)(*(long *)((long)nearest_assignments.
                                        super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x10) +
                       0x10) == 5;
      }
      uVar11 = uVar11 - 1;
      lVar9 = lVar9 + -0x18;
    } while (1 < uVar11);
  }
  return false;
}

Assistant:

bool isVarCanBeString(Node * node)
  {
    if (!node)
      return false;

    if (node->nodeType == PNT_STRING)
      return true;

    if (node->nodeType == PNT_BINARY_OP && node->tok.type == TK_NULLCOALESCE &&
      node->children[0]->nodeType == PNT_STRING)
    {
      return isVarCanBeString(node->children[0]);
    }

    if (node->nodeType == PNT_FUNCTION_CALL && node->children[0]->nodeType == PNT_ACCESS_MEMBER &&
      node->children[0]->children[1]->nodeType == PNT_IDENTIFIER)
    {
      const char * fnName = node->children[0]->children[1]->tok.u.s;
      if (settings::find(fnName, settings::function_can_return_string))
        return true;
    }

    if (node->nodeType == PNT_FUNCTION_CALL && node->children[0]->nodeType == PNT_IDENTIFIER)
    {
      const char * fnName = node->children[0]->tok.u.s;
      if (
        !strcmp(fnName, "loc")
        )
      {
        return true;
      }
    }



    for (int i = int(nearest_assignments.size()) - 1; i >= 0; i--)
      if (nearest_assignments[i].first && isNodeEquals(node, nearest_assignments[i].first))
      {
        if (nearest_assignments[i].second.first->nodeType == PNT_STRING)
          return true;
        break;
      }

    return false;
  }